

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm.cpp
# Opt level: O1

int __thiscall
ncnn::Gemm::forward(Gemm *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint uVar1;
  uint uVar2;
  Mat *pMVar3;
  size_t sVar4;
  int *piVar5;
  pointer pMVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  size_t sVar31;
  int iVar32;
  size_t *psVar33;
  void *pvVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  size_t *psVar38;
  void *pvVar39;
  int iVar40;
  int iVar41;
  size_t *psVar42;
  ulong uVar43;
  long lVar44;
  long lVar45;
  undefined4 *puVar46;
  ulong uVar47;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *pvVar48;
  ulong uVar49;
  uint uVar50;
  Mat *pMVar51;
  float *pfVar52;
  bool bVar53;
  bool bVar54;
  float fVar55;
  Mat local_158;
  Mat local_108;
  Mat local_b8;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_70;
  int local_64;
  int local_60;
  int local_5c;
  int *local_58;
  long local_50;
  void *local_48;
  void *local_40;
  size_t *local_38;
  
  pMVar3 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pMVar51 = pMVar3 + 1;
  if (this->constantA != 0) {
    pMVar51 = pMVar3;
    pMVar3 = &this->A_data;
  }
  if (this->constantB != 0) {
    pMVar51 = &this->B_data;
  }
  sVar4 = pMVar3->elemsize;
  local_108.cstep = 0;
  local_108.data = (void *)0x0;
  local_108.refcount._0_4_ = 0;
  local_108.refcount._4_4_ = 0;
  local_108.elemsize._0_4_ = 0;
  local_108.elemsize._4_4_ = 0;
  local_108.elempack = 0;
  local_108.allocator = (Allocator *)0x0;
  local_108.dims = 0;
  local_108.w = 0;
  local_108.h = 0;
  local_108.d = 0;
  local_108.c = 0;
  local_70 = top_blobs;
  if (this->transA == 0) {
    if (&local_108 != pMVar3) {
      piVar5 = pMVar3->refcount;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
      local_108.data = pMVar3->data;
      local_108.refcount._0_4_ = SUB84(pMVar3->refcount,0);
      local_108.refcount._4_4_ = (undefined4)((ulong)pMVar3->refcount >> 0x20);
      local_108.elemsize._0_4_ = (undefined4)pMVar3->elemsize;
      local_108.elemsize._4_4_ = (undefined4)(pMVar3->elemsize >> 0x20);
      local_108.elempack = pMVar3->elempack;
      local_108.allocator = pMVar3->allocator;
      uVar7 = pMVar3->dims;
      uVar8 = pMVar3->w;
      uVar9 = pMVar3->h;
      uVar10 = pMVar3->d;
      local_108.w = uVar8;
      local_108.h = uVar9;
      local_108.d = uVar10;
      local_108.c = pMVar3->c;
      local_108.cstep = pMVar3->cstep;
      local_108.dims = uVar7;
    }
  }
  else {
    Mat::create(&local_108,(&pMVar3->h)[(ulong)(pMVar3->dims == 3) * 2],pMVar3->w,sVar4,
                opt->workspace_allocator);
    if (pMVar3->dims == 3) {
      iVar40 = (int)pMVar3->cstep;
    }
    else {
      iVar40 = pMVar3->w;
    }
    if (0 < (long)local_108.h) {
      lVar44 = 0;
      lVar45 = 0;
      pvVar34 = local_108.data;
      do {
        if (0 < local_108.w) {
          puVar46 = (undefined4 *)((long)pMVar3->data + lVar44);
          uVar47 = 0;
          do {
            *(undefined4 *)((long)pvVar34 + uVar47 * 4) = *puVar46;
            uVar47 = uVar47 + 1;
            puVar46 = puVar46 + iVar40;
          } while ((uint)local_108.w != uVar47);
        }
        lVar45 = lVar45 + 1;
        lVar44 = lVar44 + 4;
        pvVar34 = (void *)((long)pvVar34 +
                          (long)local_108.w *
                          CONCAT44(local_108.elemsize._4_4_,(undefined4)local_108.elemsize));
      } while (lVar45 != local_108.h);
    }
  }
  local_b8.cstep = 0;
  local_b8.data = (void *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elemsize._4_4_ = 0;
  local_b8.elempack = 0;
  local_b8.allocator = (Allocator *)0x0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  if (this->transB == 0) {
    Mat::create(&local_b8,(&pMVar51->h)[(ulong)(pMVar51->dims == 3) * 2],pMVar51->w,sVar4,
                opt->workspace_allocator);
    if (pMVar51->dims == 3) {
      iVar40 = (int)pMVar51->cstep;
    }
    else {
      iVar40 = pMVar51->w;
    }
    if (0 < (long)local_b8.h) {
      lVar44 = 0;
      lVar45 = 0;
      pvVar34 = local_b8.data;
      do {
        if (0 < local_b8.w) {
          puVar46 = (undefined4 *)((long)pMVar51->data + lVar44);
          uVar47 = 0;
          do {
            *(undefined4 *)((long)pvVar34 + uVar47 * 4) = *puVar46;
            uVar47 = uVar47 + 1;
            puVar46 = puVar46 + iVar40;
          } while ((uint)local_b8.w != uVar47);
        }
        lVar45 = lVar45 + 1;
        lVar44 = lVar44 + 4;
        pvVar34 = (void *)((long)pvVar34 +
                          (long)local_b8.w *
                          CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize));
      } while (lVar45 != local_b8.h);
    }
  }
  else if (&local_b8 != pMVar51) {
    piVar5 = pMVar51->refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    local_b8.data = pMVar51->data;
    local_b8.refcount._0_4_ = SUB84(pMVar51->refcount,0);
    local_b8.refcount._4_4_ = (undefined4)((ulong)pMVar51->refcount >> 0x20);
    local_b8.elemsize._0_4_ = (undefined4)pMVar51->elemsize;
    local_b8.elemsize._4_4_ = (undefined4)(pMVar51->elemsize >> 0x20);
    local_b8.elempack = pMVar51->elempack;
    local_b8.allocator = pMVar51->allocator;
    uVar11 = pMVar51->dims;
    uVar12 = pMVar51->w;
    uVar13 = pMVar51->h;
    uVar14 = pMVar51->d;
    local_b8.w = uVar12;
    local_b8.h = uVar13;
    local_b8.d = uVar14;
    local_b8.c = pMVar51->c;
    local_b8.cstep = pMVar51->cstep;
    local_b8.dims = uVar11;
  }
  iVar40 = local_108.w;
  uVar47 = (ulong)(uint)local_108.w;
  uVar1 = (&local_108.h)[(ulong)(local_108.dims == 3) * 2];
  uVar2 = (&local_b8.h)[(ulong)(local_b8.dims == 3) * 2];
  if (this->constantC != 0) {
    pfVar52 = (float *)(this->C_data).data;
    uVar50 = this->constant_broadcast_type_C;
    goto LAB_004d7a64;
  }
  if (this->constantB == 0 || this->constantA == 0) {
    if (this->constantA == 0) {
      if (this->constantB == 0) {
        pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar6 == 0xd8) {
          local_158.data = pMVar6[2].data;
          piVar5 = pMVar6[2].refcount;
          local_158.refcount._0_4_ = SUB84(piVar5,0);
          local_158.refcount._4_4_ = (undefined4)((ulong)piVar5 >> 0x20);
          local_158.elemsize._0_4_ = (undefined4)pMVar6[2].elemsize;
          local_158.elemsize._4_4_ = (undefined4)(pMVar6[2].elemsize >> 0x20);
          local_158.elempack = pMVar6[2].elempack;
          local_158.allocator = pMVar6[2].allocator;
          uVar27 = pMVar6[2].dims;
          uVar28 = pMVar6[2].w;
          uVar29 = pMVar6[2].h;
          uVar30 = pMVar6[2].d;
          local_158.c = pMVar6[2].c;
          local_158.cstep = pMVar6[2].cstep;
          local_158.dims = uVar27;
          local_158.w = uVar28;
          local_158.h = uVar29;
          local_158.d = uVar30;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + 1;
            UNLOCK();
          }
        }
        else {
          local_158.cstep = 0;
          local_158.data = (float *)0x0;
          local_158.refcount._0_4_ = 0;
          local_158.refcount._4_4_ = 0;
          local_158.elemsize._0_4_ = 0;
          local_158.elemsize._4_4_ = 0;
          local_158.elempack = 0;
          local_158.allocator = (Allocator *)0x0;
          local_158.dims = 0;
          local_158.w = 0;
          local_158.h = 0;
          local_158.d = 0;
          local_158.c = 0;
          Mat::create(&local_158,0,4,(Allocator *)0x0);
        }
        pfVar52 = (float *)local_158.data;
        piVar5 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_158.allocator == (Allocator *)0x0) goto LAB_004d79c7;
            (*(local_158.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      else {
        pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)pMVar6 == 0x90) {
          local_158.data = pMVar6[1].data;
          piVar5 = pMVar6[1].refcount;
          local_158.refcount._0_4_ = SUB84(piVar5,0);
          local_158.refcount._4_4_ = (undefined4)((ulong)piVar5 >> 0x20);
          local_158.elemsize._0_4_ = (undefined4)pMVar6[1].elemsize;
          local_158.elemsize._4_4_ = (undefined4)(pMVar6[1].elemsize >> 0x20);
          local_158.elempack = pMVar6[1].elempack;
          local_158.allocator = pMVar6[1].allocator;
          uVar23 = pMVar6[1].dims;
          uVar24 = pMVar6[1].w;
          uVar25 = pMVar6[1].h;
          uVar26 = pMVar6[1].d;
          local_158.c = pMVar6[1].c;
          local_158.cstep = pMVar6[1].cstep;
          local_158.dims = uVar23;
          local_158.w = uVar24;
          local_158.h = uVar25;
          local_158.d = uVar26;
          if (piVar5 != (int *)0x0) {
            LOCK();
            *piVar5 = *piVar5 + 1;
            UNLOCK();
          }
        }
        else {
          local_158.cstep = 0;
          local_158.data = (float *)0x0;
          local_158.refcount._0_4_ = 0;
          local_158.refcount._4_4_ = 0;
          local_158.elemsize._0_4_ = 0;
          local_158.elemsize._4_4_ = 0;
          local_158.elempack = 0;
          local_158.allocator = (Allocator *)0x0;
          local_158.dims = 0;
          local_158.w = 0;
          local_158.h = 0;
          local_158.d = 0;
          local_158.c = 0;
          Mat::create(&local_158,0,4,(Allocator *)0x0);
        }
        pfVar52 = (float *)local_158.data;
        piVar5 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + -1;
          UNLOCK();
          if (*piVar5 == 0) {
            if (local_158.allocator == (Allocator *)0x0) {
LAB_004d79c7:
              pfVar52 = (float *)local_158.data;
              if ((float *)local_158.data != (float *)0x0) {
                free(local_158.data);
              }
            }
            else {
              (*(local_158.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
    }
    else {
      pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pMVar6 == 0x90) {
        local_158.data = pMVar6[1].data;
        piVar5 = pMVar6[1].refcount;
        local_158.refcount._0_4_ = SUB84(piVar5,0);
        local_158.refcount._4_4_ = (undefined4)((ulong)piVar5 >> 0x20);
        local_158.elemsize._0_4_ = (undefined4)pMVar6[1].elemsize;
        local_158.elemsize._4_4_ = (undefined4)(pMVar6[1].elemsize >> 0x20);
        local_158.elempack = pMVar6[1].elempack;
        local_158.allocator = pMVar6[1].allocator;
        uVar15 = pMVar6[1].dims;
        uVar16 = pMVar6[1].w;
        uVar17 = pMVar6[1].h;
        uVar18 = pMVar6[1].d;
        local_158.c = pMVar6[1].c;
        local_158.cstep = pMVar6[1].cstep;
        local_158.dims = uVar15;
        local_158.w = uVar16;
        local_158.h = uVar17;
        local_158.d = uVar18;
        if (piVar5 != (int *)0x0) {
          LOCK();
          *piVar5 = *piVar5 + 1;
          UNLOCK();
        }
      }
      else {
        local_158.cstep = 0;
        local_158.data = (float *)0x0;
        local_158.refcount._0_4_ = 0;
        local_158.refcount._4_4_ = 0;
        local_158.elemsize._0_4_ = 0;
        local_158.elemsize._4_4_ = 0;
        local_158.elempack = 0;
        local_158.allocator = (Allocator *)0x0;
        local_158.dims = 0;
        local_158.w = 0;
        local_158.h = 0;
        local_158.d = 0;
        local_158.c = 0;
        Mat::create(&local_158,0,4,(Allocator *)0x0);
      }
      pfVar52 = (float *)local_158.data;
      piVar5 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + -1;
        UNLOCK();
        if (*piVar5 == 0) {
          if (local_158.allocator == (Allocator *)0x0) goto LAB_004d79c7;
          (*(local_158.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pMVar6 == 0x48) {
      local_158.data = pMVar6->data;
      piVar5 = pMVar6->refcount;
      local_158.refcount._0_4_ = SUB84(piVar5,0);
      local_158.refcount._4_4_ = (undefined4)((ulong)piVar5 >> 0x20);
      local_158.elemsize._0_4_ = (undefined4)pMVar6->elemsize;
      local_158.elemsize._4_4_ = (undefined4)(pMVar6->elemsize >> 0x20);
      local_158.elempack = pMVar6->elempack;
      local_158.allocator = pMVar6->allocator;
      uVar19 = pMVar6->dims;
      uVar20 = pMVar6->w;
      uVar21 = pMVar6->h;
      uVar22 = pMVar6->d;
      local_158.c = pMVar6->c;
      local_158.cstep = pMVar6->cstep;
      local_158.dims = uVar19;
      local_158.w = uVar20;
      local_158.h = uVar21;
      local_158.d = uVar22;
      if (piVar5 != (int *)0x0) {
        LOCK();
        *piVar5 = *piVar5 + 1;
        UNLOCK();
      }
    }
    else {
      local_158.cstep = 0;
      local_158.data = (float *)0x0;
      local_158.refcount._0_4_ = 0;
      local_158.refcount._4_4_ = 0;
      local_158.elemsize._0_4_ = 0;
      local_158.elemsize._4_4_ = 0;
      local_158.elempack = 0;
      local_158.allocator = (Allocator *)0x0;
      local_158.dims = 0;
      local_158.w = 0;
      local_158.h = 0;
      local_158.d = 0;
      local_158.c = 0;
      Mat::create(&local_158,0,4,(Allocator *)0x0);
    }
    pfVar52 = (float *)local_158.data;
    piVar5 = (int *)CONCAT44(local_158.refcount._4_4_,local_158.refcount._0_4_);
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + -1;
      UNLOCK();
      if (*piVar5 == 0) {
        if (local_158.allocator == (Allocator *)0x0) goto LAB_004d79c7;
        (*(local_158.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (pfVar52 == (float *)0x0) {
    pfVar52 = (float *)0x0;
    uVar50 = 0;
  }
  else {
    pMVar6 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    iVar32 = pMVar6[-1].dims;
    uVar50 = pMVar6[-1].w;
    bVar53 = uVar50 == uVar2;
    uVar36 = (uint)(uVar50 == uVar1 && iVar32 == 1);
    uVar35 = uVar36;
    if (bVar53) {
      uVar35 = 4;
    }
    if (iVar32 != 1) {
      uVar35 = uVar36;
    }
    uVar36 = pMVar6[-1].h;
    uVar37 = 2;
    if (uVar36 != uVar1) {
      uVar37 = uVar35;
    }
    if (uVar50 != 1) {
      uVar37 = uVar35;
    }
    bVar54 = iVar32 != 2;
    if (bVar54) {
      uVar37 = uVar35;
    }
    uVar35 = 3;
    if (uVar36 != uVar1) {
      uVar35 = uVar37;
    }
    if (bVar54 || !bVar53) {
      uVar35 = uVar37;
    }
    uVar50 = 4;
    if (uVar36 != 1) {
      uVar50 = uVar35;
    }
    if (bVar54 || !bVar53) {
      uVar50 = uVar35;
    }
  }
LAB_004d7a64:
  uVar35 = uVar2;
  uVar36 = uVar1;
  if (this->output_transpose == 0) {
    uVar35 = uVar1;
    uVar36 = uVar2;
  }
  pMVar51 = (local_70->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (this->output_N1M == 0) {
    Mat::create(pMVar51,uVar36,uVar35,sVar4,opt->blob_allocator);
  }
  else {
    Mat::create(pMVar51,uVar36,1,uVar35,sVar4,opt->blob_allocator);
  }
  pvVar34 = pMVar51->data;
  iVar32 = -100;
  if ((pvVar34 != (void *)0x0) && ((long)pMVar51->c * pMVar51->cstep != 0)) {
    if (0 < (int)uVar1) {
      local_5c = pMVar51->dims;
      local_60 = local_b8.dims;
      local_40 = local_108.data;
      local_48 = local_b8.data;
      local_64 = this->output_transpose;
      local_50 = (long)(int)uVar2;
      local_70 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)(ulong)uVar1;
      lVar44 = 0;
      local_58 = &pMVar51->w;
      local_38 = &pMVar51->cstep;
      pvVar48 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)0x0;
      do {
        psVar33 = (size_t *)&local_108.w;
        if (local_108.dims == 3) {
          psVar33 = &local_108.cstep;
        }
        if (0 < (int)uVar2) {
          psVar38 = (size_t *)&local_b8.w;
          if (local_b8.dims == 3) {
            psVar38 = &local_b8.cstep;
          }
          psVar42 = (size_t *)local_58;
          if (local_5c == 3) {
            psVar42 = local_38;
          }
          sVar4 = *psVar33;
          iVar32 = (int)*psVar42;
          iVar41 = iVar32;
          if (local_64 == 0) {
            iVar41 = 1;
          }
          sVar31 = *psVar38;
          if (local_64 != 0) {
            iVar32 = 1;
          }
          uVar49 = 0;
          pvVar39 = local_b8.data;
          do {
            fVar55 = 0.0;
            if (pfVar52 != (float *)0x0) {
              if (uVar50 == 0) {
                fVar55 = *pfVar52;
              }
              if (uVar50 == 1) {
                fVar55 = pfVar52[(long)pvVar48];
              }
              if (uVar50 == 2) {
                fVar55 = pfVar52[(long)pvVar48];
              }
              if (uVar50 == 3) {
                fVar55 = pfVar52[uVar49 + (long)pvVar48 * local_50];
              }
              if (uVar50 == 4) {
                fVar55 = pfVar52[uVar49];
              }
              fVar55 = fVar55 * this->beta;
            }
            if (0 < iVar40) {
              uVar43 = 0;
              do {
                fVar55 = fVar55 + *(float *)((long)pvVar39 + uVar43 * 4) *
                                  *(float *)((long)local_108.data + uVar43 * 4 + (int)sVar4 * lVar44
                                            );
                uVar43 = uVar43 + 1;
              } while (uVar47 != uVar43);
            }
            *(float *)((long)pvVar34 + uVar49 * (long)iVar41 * 4 + (long)iVar32 * (long)pvVar48 * 4)
                 = fVar55 * this->alpha;
            uVar49 = uVar49 + 1;
            pvVar39 = (void *)((long)pvVar39 + (long)(int)sVar31 * 4);
          } while (uVar49 != uVar2);
        }
        pvVar48 = (vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                  ((long)&(pvVar48->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start + 1);
        lVar44 = lVar44 + 4;
      } while (pvVar48 != local_70);
    }
    iVar32 = 0;
  }
  piVar5 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        if (local_b8.data != (void *)0x0) {
          free(local_b8.data);
        }
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_b8.cstep = 0;
  local_b8.data = (void *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elemsize._4_4_ = 0;
  local_b8.elempack = 0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  local_b8.c = 0;
  piVar5 = (int *)CONCAT44(local_108.refcount._4_4_,local_108.refcount._0_4_);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_108.allocator == (Allocator *)0x0) {
        if (local_108.data != (void *)0x0) {
          free(local_108.data);
        }
      }
      else {
        (*(local_108.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar32;
}

Assistant:

int Gemm::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& A0 = constantA ? A_data : bottom_blobs[0];
    const Mat& B0 = constantB ? B_data : constantA ? bottom_blobs[0] : bottom_blobs[1];

    size_t elemsize = A0.elemsize;

    Mat A;
    if (transA == 0)
    {
        A = A0;
    }
    else
    {
        // transpose A to row-major
        A.create((A0.dims == 3 ? A0.c : A0.h), A0.w, elemsize, opt.workspace_allocator);

        const int A0_hstep = A0.dims == 3 ? (int)A0.cstep : A0.w;

        for (int i = 0; i < A.h; i++)
        {
            float* ptr = A.row(i);
            for (int j = 0; j < A.w; j++)
            {
                ptr[j] = A0[j * A0_hstep + i];
            }
        }
    }

    Mat B;
    if (transB == 0)
    {
        // transpose B to col-major
        B.create((B0.dims == 3 ? B0.c : B0.h), B0.w, elemsize, opt.workspace_allocator);

        const int B0_hstep = B0.dims == 3 ? (int)B0.cstep : B0.w;

        for (int i = 0; i < B.h; i++)
        {
            float* ptr = B.row(i);
            for (int j = 0; j < B.w; j++)
            {
                ptr[j] = B0[j * B0_hstep + i];
            }
        }
    }
    else
    {
        B = B0;
    }

    const int M = A.dims == 3 ? A.c : A.h;
    const int K = A.w; // assert A.w == B.w
    const int N = B.dims == 3 ? B.c : B.h;

    const float* ptrC = 0;
    int broadcast_type_C = 0;
    if (constantC)
    {
        ptrC = C_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB)
        {
            ptrC = bottom_blobs.size() == 1 ? bottom_blobs[0] : 0;
        }
        else if (constantA)
        {
            ptrC = bottom_blobs.size() == 2 ? bottom_blobs[1] : 0;
        }
        else if (constantB)
        {
            ptrC = bottom_blobs.size() == 2 ? bottom_blobs[1] : 0;
        }
        else
        {
            ptrC = bottom_blobs.size() == 3 ? bottom_blobs[2] : 0;
        }

        if (ptrC)
        {
            const Mat& C = bottom_blobs[bottom_blobs.size() - 1];

            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }
        }
    }

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N, elemsize, opt.blob_allocator);
        else
            top_blob.create(M, N, elemsize, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M, elemsize, opt.blob_allocator);
        else
            top_blob.create(N, M, elemsize, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < M; i++)
    {
        const int out_hstep = top_blob.dims == 3 ? (int)top_blob.cstep : top_blob.w;

        const int A_hstep = A.dims == 3 ? (int)A.cstep : A.w;
        const int B_hstep = B.dims == 3 ? (int)B.cstep : B.w;

        const float* ptrA = (const float*)A + i * A_hstep;

        for (int j = 0; j < N; j++)
        {
            const float* ptrB = (const float*)B + j * B_hstep;

            float sum = 0.f;
            if (ptrC)
            {
                if (broadcast_type_C == 0)
                {
                    sum = ptrC[0];
                }
                if (broadcast_type_C == 1)
                {
                    sum = ptrC[i];
                }
                if (broadcast_type_C == 2)
                {
                    sum = ptrC[i];
                }
                if (broadcast_type_C == 3)
                {
                    sum = ptrC[i * N + j];
                }
                if (broadcast_type_C == 4)
                {
                    sum = ptrC[j];
                }

                sum *= beta;
            }

            for (int k = 0; k < K; k++)
            {
                sum += ptrA[k] * ptrB[k];
            }

            sum *= alpha;

            if (output_transpose)
            {
                top_blob[j * out_hstep + i] = sum;
            }
            else
            {
                top_blob[i * out_hstep + j] = sum;
            }
        }
    }

    return 0;
}